

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Input.cxx
# Opt level: O2

void __thiscall Fl_Value_Input::Fl_Value_Input(Fl_Value_Input *this,int X,int Y,int W,int H,char *l)

{
  uint *puVar1;
  Fl_Group *this_00;
  _func_int **pp_Var2;
  Fl_Color FVar3;
  
  Fl_Valuator::Fl_Valuator(&this->super_Fl_Valuator,X,Y,W,H,l);
  (this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Value_Input_00279d50;
  Fl_Input::Fl_Input(&this->input,X,Y,W,H,(char *)0x0);
  this->soft_ = '\0';
  this_00 = (this->input).super_Fl_Input_.super_Fl_Widget.parent_;
  if (this_00 != (Fl_Group *)0x0) {
    Fl_Group::remove(this_00,(char *)&this->input);
  }
  (this->input).super_Fl_Input_.super_Fl_Widget.parent_ = (Fl_Group *)this;
  (this->input).super_Fl_Input_.super_Fl_Widget.callback_ = input_cb;
  (this->input).super_Fl_Input_.super_Fl_Widget.user_data_ = this;
  (this->input).super_Fl_Input_.super_Fl_Widget.when_ = '\x01';
  (this->super_Fl_Valuator).super_Fl_Widget.box_ =
       (this->input).super_Fl_Input_.super_Fl_Widget.box_;
  pp_Var2 = (this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget;
  FVar3 = (this->input).super_Fl_Input_.super_Fl_Widget.color2_;
  (this->super_Fl_Valuator).super_Fl_Widget.color_ =
       (this->input).super_Fl_Input_.super_Fl_Widget.color_;
  (this->super_Fl_Valuator).super_Fl_Widget.color2_ = FVar3;
  (this->super_Fl_Valuator).super_Fl_Widget.label_.align_ = 4;
  (*pp_Var2[10])(this);
  puVar1 = &(this->super_Fl_Valuator).super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x40;
  return;
}

Assistant:

Fl_Value_Input::Fl_Value_Input(int X, int Y, int W, int H, const char* l)
: Fl_Valuator(X, Y, W, H, l), input(X, Y, W, H, 0) {
  soft_ = 0;
  if (input.parent())  // defeat automatic-add
    input.parent()->remove(input);
  input.parent((Fl_Group *)this); // kludge!
  input.callback(input_cb, this);
  input.when(FL_WHEN_CHANGED);
  box(input.box());
  color(input.color());
  selection_color(input.selection_color());
  align(FL_ALIGN_LEFT);
  value_damage();
  set_flag(SHORTCUT_LABEL);
}